

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

int vector2_equals(vector2 *self,vector2 *vT)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = (self->field_0).v[0] - (vT->field_0).v[0];
  fVar3 = -fVar2;
  if (-fVar2 <= fVar2) {
    fVar3 = fVar2;
  }
  uVar1 = 0;
  if (fVar3 < 1e-05) {
    fVar2 = (self->field_0).v[1] - (vT->field_0).v[1];
    fVar3 = -fVar2;
    if (-fVar2 <= fVar2) {
      fVar3 = fVar2;
    }
    uVar1 = (uint)(fVar3 < 1e-05);
  }
  return uVar1;
}

Assistant:

HYPAPI int vector2_equals(const struct vector2 *self, const struct vector2 *vT)
{
	return scalar_equals(self->x, vT->x) && scalar_equals(self->y, vT->y);
}